

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

Node * mainpositionTV(Table *t,TValue *key)

{
  Node *pNVar1;
  uint uVar2;
  GCObject *o;
  lua_CFunction f;
  void *p;
  TString *ts_1;
  TString *ts;
  lua_Number n;
  lua_Integer i;
  TValue *key_local;
  Table *t_local;
  
  switch(key->tt_ & 0x3f) {
  case 1:
    t_local = (Table *)t->node;
    break;
  case 2:
    t_local = (Table *)(t->node +
                       ((key->value_).i & 0xffffffffU) %
                       (ulong)((1 << (t->lsizenode & 0x1f)) - 1U | 1));
    break;
  case 3:
    t_local = (Table *)hashint(t,(key->value_).i);
    break;
  case 4:
    t_local = (Table *)(t->node +
                       (*(uint *)((key->value_).f + 0xc) & (1 << (t->lsizenode & 0x1f)) - 1U));
    break;
  default:
    t_local = (Table *)(t->node +
                       ((key->value_).i & 0xffffffffU) %
                       (ulong)((1 << (t->lsizenode & 0x1f)) - 1U | 1));
    break;
  case 0x11:
    t_local = (Table *)(t->node + ((1 << (t->lsizenode & 0x1f)) - 1U & 1));
    break;
  case 0x13:
    pNVar1 = t->node;
    uVar2 = l_hashfloat((key->value_).n);
    t_local = (Table *)(pNVar1 + (ulong)uVar2 % (ulong)((1 << (t->lsizenode & 0x1f)) - 1U | 1));
    break;
  case 0x14:
    pNVar1 = t->node;
    uVar2 = luaS_hashlongstr((TString *)(key->value_).gc);
    t_local = (Table *)(pNVar1 + (uVar2 & (1 << (t->lsizenode & 0x1f)) - 1U));
    break;
  case 0x16:
    t_local = (Table *)(t->node +
                       ((key->value_).i & 0xffffffffU) %
                       (ulong)((1 << (t->lsizenode & 0x1f)) - 1U | 1));
  }
  return (Node *)t_local;
}

Assistant:

static Node *mainpositionTV (const Table *t, const TValue *key) {
  switch (ttypetag(key)) {
    case LUA_VNUMINT: {
      lua_Integer i = ivalue(key);
      return hashint(t, i);
    }
    case LUA_VNUMFLT: {
      lua_Number n = fltvalue(key);
      return hashmod(t, l_hashfloat(n));
    }
    case LUA_VSHRSTR: {
      TString *ts = tsvalue(key);
      return hashstr(t, ts);
    }
    case LUA_VLNGSTR: {
      TString *ts = tsvalue(key);
      return hashpow2(t, luaS_hashlongstr(ts));
    }
    case LUA_VFALSE:
      return hashboolean(t, 0);
    case LUA_VTRUE:
      return hashboolean(t, 1);
    case LUA_VLIGHTUSERDATA: {
      void *p = pvalue(key);
      return hashpointer(t, p);
    }
    case LUA_VLCF: {
      lua_CFunction f = fvalue(key);
      return hashpointer(t, f);
    }
    default: {
      GCObject *o = gcvalue(key);
      return hashpointer(t, o);
    }
  }
}